

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void init_films(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  film **ppfVar3;
  unique_ptr<spatial_region,_std::default_delete<spatial_region>_> this;
  int iVar4;
  film *pfVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 in_XMM8_Qb;
  
  pfVar5 = p_last_film;
  if (p_last_film != (film *)0x0) {
    do {
      if (((pfVar5->xnpic_film == 0) || (pfVar5->ynpic_film == 0)) || (pfVar5->znpic_film == 0)) {
        pfVar5->xnpic_film = xnpic;
        pfVar5->ynpic_film = ynpic;
        pfVar5->znpic_film = znpic;
      }
      dVar7 = pfVar5->ne;
      if ((dVar7 != 0.0) || (NAN(dVar7))) {
        pfVar5->ne_y0 = dVar7;
        pfVar5->ne_y1 = dVar7;
        dVar6 = dVar7;
      }
      else {
        dVar7 = pfVar5->ne_y0;
        dVar6 = pfVar5->ne_y1;
      }
      this._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
      super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
      super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
           psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t
           .super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
           super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = pfVar5->x0;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dx;
      auVar13._0_8_ =
           (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[mpi_rank];
      auVar13._8_8_ = in_XMM8_Qb;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = pfVar5->x0 + pfVar5->filmwidth;
      auVar14 = vfnmadd231sd_fma(auVar14,auVar11,auVar13);
      auVar9 = vfnmadd213sd_fma(auVar13,auVar11,auVar9);
      dVar8 = (11148500000000.0 / lambda) / lambda;
      iVar4 = std::__cxx11::string::compare((char *)&ions_abi_cxx11_);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = nerflow;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = nelflow;
      uVar1 = vcmppd_avx512vl(auVar10,ZEXT816(0) << 0x40,4);
      uVar2 = vcmppd_avx512vl(auVar12,ZEXT816(0) << 0x40,4);
      spatial_region::film
                ((spatial_region *)
                 this._M_t.
                 super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                 super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                 super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,auVar9._0_8_,
                 auVar14._0_8_,dVar7 / dVar8,dVar6 / dVar8,(uint)(iVar4 == 0),
                 1.0 / (pfVar5->mcr * 1836.1526721),pfVar5->gradwidth,pfVar5->y0,pfVar5->y1,
                 pfVar5->z0,pfVar5->z1,pfVar5->T,pfVar5->vx,
                 (bool)(((byte)uVar2 & 3 | (byte)uVar1 & 3) & 1),pfVar5->xnpic_film,
                 pfVar5->ynpic_film,pfVar5->znpic_film,false,pfVar5->gradwidth_y);
      ppfVar3 = &pfVar5->prev;
      pfVar5 = *ppfVar3;
    } while (*ppfVar3 != (film *)0x0);
  }
  return;
}

Assistant:

void init_films()
{
    film* tmp_p_film = p_last_film;
    while (tmp_p_film!=0)
    {
        /* x0film - координата левой границы плёнки, filmwidth - её
         * толщина, gradwidth - толщина части плёнки с линейным ростом
         * плотности */
        if (tmp_p_film->xnpic_film == 0 || tmp_p_film->ynpic_film == 0 || tmp_p_film->znpic_film == 0)
        {
            tmp_p_film->xnpic_film = xnpic;
            tmp_p_film->ynpic_film = ynpic;
            tmp_p_film->znpic_film = znpic;
        }
        if (tmp_p_film->ne != 0)
        {
            tmp_p_film->ne_y0 = tmp_p_film->ne;
            tmp_p_film->ne_y1 = tmp_p_film->ne;
        }

        psr->film(
            tmp_p_film->x0-dx*x0_sr[mpi_rank], 
            tmp_p_film->x0+tmp_p_film->filmwidth-dx*x0_sr[mpi_rank],
            tmp_p_film->ne_y0/(1.11485e+13/lambda/lambda),
            tmp_p_film->ne_y1/(1.11485e+13/lambda/lambda),
            ions == "on",
            1/(proton_mass*tmp_p_film->mcr),
            tmp_p_film->gradwidth,
            tmp_p_film->y0,
            tmp_p_film->y1,
            tmp_p_film->z0,
            tmp_p_film->z1,
            tmp_p_film->T,
            tmp_p_film->vx,
            nelflow != 0 || nerflow != 0,
            tmp_p_film->xnpic_film,
            tmp_p_film->ynpic_film,
            tmp_p_film->znpic_film,
            false,
            tmp_p_film->gradwidth_y
        );
        tmp_p_film = tmp_p_film->prev;
    }
}